

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void console_draw_pct(float _pct)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *local_90;
  float local_78;
  int local_74;
  int local_6c;
  int i_1;
  int pct;
  allocator local_51;
  string local_50 [8];
  string deleteLine;
  size_t i;
  size_t l;
  size_t cols;
  size_t lines;
  float _pct_local;
  
  bVar1 = console_is_init();
  if (bVar1) {
    if (cmd_win == (WINDOW *)0x0) {
      local_74 = -1;
    }
    else {
      local_74 = cmd_win->_maxx + 1;
    }
    werase(cmd_win);
    box(cmd_win,0);
    local_78 = (float)((long)local_74 - 4);
    uVar2 = (ulong)(local_78 * _pct);
    wattr_on(cmd_win,0x200,0);
    for (deleteLine.field_2._8_8_ = 0; (ulong)deleteLine.field_2._8_8_ < (long)local_74 - 4U;
        deleteLine.field_2._8_8_ = deleteLine.field_2._8_8_ + 1) {
      if ((ulong)deleteLine.field_2._8_8_ <
          (uVar2 | (long)(local_78 * _pct - 9.223372e+18) & (long)uVar2 >> 0x3f)) {
        local_90 = "#";
      }
      else {
        local_90 = ".";
      }
      mvwprintw(cmd_win,1,(int)deleteLine.field_2._8_8_ + 2,"%s",local_90);
    }
    wattr_off(cmd_win,0x200,0);
    wrefresh(cmd_win);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"\x1b[2K\r\x1b[1A",&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::operator<<((ostream *)&std::cout,local_50);
    std::operator<<((ostream *)&std::cout,"// [ ");
    for (local_6c = 0; local_6c < 0x32; local_6c = local_6c + 1) {
      if (local_6c < (int)(_pct * 100.0) / 2) {
        std::operator<<((ostream *)&std::cout,"#");
      }
      else {
        std::operator<<((ostream *)&std::cout,".");
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout," ] ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)(_pct * 100.0));
    poVar3 = std::operator<<(poVar3,"%");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void console_draw_pct(float _pct) {
    #if defined(SUPPORT_NCURSES)

    if (console_is_init()) {
        size_t lines, cols;
        getmaxyx(cmd_win, lines, cols);

        werase(cmd_win);
        box(cmd_win,0, 0);
        // wborder(cmd_win, '|', '|', '-', '-', '+', '+', '+', '+');

        size_t l = (cols-4) * _pct;
        wattron(cmd_win, COLOR_PAIR(2));
        for (size_t i = 0; i < cols-4; i++)
            mvwprintw(cmd_win, 1, 2 + i, "%s", (i < l )? "#" : ".");
        wattroff(cmd_win, COLOR_PAIR(2));

        wrefresh(cmd_win);
    } else 
    #endif
    {
        // Delete previous line
        const std::string deleteLine = "\e[2K\r\e[1A";
        std::cout << deleteLine;

        int pct = 100 * _pct;
        std::cout << "// [ ";
        for (int i = 0; i < 50; i++) {
            if (i < pct/2) {
                std::cout << "#";
            }
            else {
                std::cout << ".";
            }
        }
        std::cout << " ] " << pct << "%" << std::endl;
    }
}